

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation.h
# Opt level: O1

void __thiscall
sptk::InputSourceInterpolation::~InputSourceInterpolation(InputSourceInterpolation *this)

{
  ~InputSourceInterpolation(this);
  operator_delete(this);
  return;
}

Assistant:

~InputSourceInterpolation() override {
  }